

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

bool __thiscall
CStorage::FindFile(CStorage *this,char *pFilename,char *pPath,int Type,char *pBuffer,int BufferSize,
                  SHA256_DIGEST *pWantedSha256,uint WantedCrc,uint WantedSize)

{
  long lVar1;
  bool bVar2;
  CFindCBData *in_RDX;
  undefined8 in_RSI;
  CStorage *in_RDI;
  long in_FS_OFFSET;
  CFindCBData Data;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = FindFileImpl(in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

virtual bool FindFile(const char *pFilename, const char *pPath, int Type, char *pBuffer, int BufferSize, const SHA256_DIGEST *pWantedSha256, unsigned WantedCrc, unsigned WantedSize)
	{
		CFindCBData Data;
		Data.m_pStorage = this;
		Data.m_pFilename = pFilename;
		Data.m_pPath = pPath;
		Data.m_pBuffer = pBuffer;
		Data.m_BufferSize = BufferSize;
		Data.m_pWantedSha256 = pWantedSha256;
		Data.m_WantedCrc = WantedCrc;
		Data.m_WantedSize = WantedSize;
		Data.m_CheckHashAndSize = true;
		return FindFileImpl(Type, &Data);
	}